

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddDotMinProduct6(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddObj *pAVar1;
  Abc_ZddObj *pAVar2;
  Abc_ZddObj *pAVar3;
  int iVar4;
  int iVar5;
  int b_00;
  uint uVar6;
  uint Arg0;
  uint a_00;
  
  do {
    Arg0 = a;
    a = b;
    if (Arg0 == 0) {
      return 0;
    }
    if (a == 0) {
      return 0;
    }
    if (Arg0 == 1) {
      return a;
    }
    if (a == 1) {
      return Arg0;
    }
    b = Arg0;
  } while (a < (int)Arg0);
  iVar4 = Abc_ZddCacheLookup(p,Arg0,a,0xb);
  if (-1 < iVar4) {
    return iVar4;
  }
  pAVar3 = p->pObjs;
  pAVar1 = pAVar3 + (int)Arg0;
  pAVar2 = pAVar3 + a;
  if ((*(uint *)(pAVar3 + (int)Arg0) & 0x7fffffff) < (*(uint *)(pAVar3 + a) & 0x7fffffff)) {
    iVar4 = Abc_ZddDotMinProduct6(p,pAVar1->False,a);
    a_00 = pAVar1->True;
    uVar6 = a;
  }
  else {
    if ((*(uint *)(pAVar3 + (int)Arg0) & 0x7fffffff) <= (*(uint *)(pAVar3 + a) & 0x7fffffff)) {
      iVar4 = Abc_ZddDotMinProduct6(p,pAVar1->False,pAVar2->False);
      iVar5 = Abc_ZddMinUnion(p,pAVar2->False,pAVar2->True);
      iVar5 = Abc_ZddDotMinProduct6(p,pAVar1->True,iVar5);
      b_00 = Abc_ZddDotMinProduct6(p,pAVar1->False,pAVar2->True);
      iVar5 = Abc_ZddMinUnion(p,iVar5,b_00);
      goto LAB_003d4f55;
    }
    iVar4 = Abc_ZddDotMinProduct6(p,Arg0,pAVar2->False);
    uVar6 = pAVar2->True;
    a_00 = Arg0;
  }
  iVar5 = Abc_ZddDotMinProduct6(p,a_00,uVar6);
LAB_003d4f55:
  iVar5 = Abc_ZddThresh(p,iVar5,5);
  iVar5 = Abc_ZddDiff(p,iVar5,iVar4);
  uVar6 = *(uint *)pAVar2 & 0x7fffffff;
  if ((*(uint *)pAVar1 & 0x7fffffff) < (*(uint *)pAVar2 & 0x7fffffff)) {
    uVar6 = *(uint *)pAVar1 & 0x7fffffff;
  }
  iVar4 = Abc_ZddUniqueCreate(p,uVar6,iVar5,iVar4);
  Abc_ZddCacheInsert(p,Arg0,a,0xb,iVar4);
  return iVar4;
}

Assistant:

int Abc_ZddDotMinProduct6( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A, * B; 
    int r0, r1, b2, t1, t2, r;
    if ( a == 0 ) return 0;
    if ( b == 0 ) return 0;
    if ( a == 1 ) return b;
    if ( b == 1 ) return a;
    if ( a > b )  return Abc_ZddDotMinProduct6( p, b, a );
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_DOT_PROD_6)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    B = Abc_ZddNode( p, b );
    if ( A->Var < B->Var )
        r0 = Abc_ZddDotMinProduct6( p, A->False, b ), 
        r1 = Abc_ZddDotMinProduct6( p, A->True, b );
    else if ( A->Var > B->Var )
        r0 = Abc_ZddDotMinProduct6( p, a, B->False ), 
        r1 = Abc_ZddDotMinProduct6( p, a, B->True ); 
    else
        r0 = Abc_ZddDotMinProduct6( p, A->False, B->False ),
        b2 = Abc_ZddMinUnion( p, B->False, B->True ), 
        t1 = Abc_ZddDotMinProduct6( p, A->True, b2 ), 
        t2 = Abc_ZddDotMinProduct6( p, A->False, B->True ), 
        r1 = Abc_ZddMinUnion( p, t1, t2 );
    r1 = Abc_ZddThresh( p, r1, 5 ),
    r1 = Abc_ZddDiff( p, r1, r0 ); 
    r = Abc_ZddUniqueCreate( p, Abc_MinInt(A->Var, B->Var), r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_DOT_PROD_6, r );
}